

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsMotor::ConstraintsFbLoadForces(ChShaftsMotor *this,double factor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Scalar *pSVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_30 [24];
  
  if (this->motor_mode == MOT_MODE_TORQUE) {
    dVar1 = this->motor_torque;
    ChVariables::Get_fb((ChVectorRef *)local_30,
                        &(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1)->variables).
                         super_ChVariables);
    pSVar4 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()(local_30,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = factor;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *pSVar4;
    auVar2 = vfmadd213sd_fma(auVar7,auVar5,auVar2);
    *pSVar4 = auVar2._0_8_;
    dVar1 = this->motor_torque;
    ChVariables::Get_fb((ChVectorRef *)local_30,
                        &(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft2)->variables).
                         super_ChVariables);
    pSVar4 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()(local_30,0);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = factor;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *pSVar4;
    auVar2 = vfnmadd213sd_fma(auVar8,auVar6,auVar3);
    *pSVar4 = auVar2._0_8_;
  }
  return;
}

Assistant:

void ChShaftsMotor::ConstraintsFbLoadForces(double factor) {
    if (motor_mode == MOT_MODE_TORQUE) {
        shaft1->Variables().Get_fb()(0) += motor_torque * factor;
        shaft2->Variables().Get_fb()(0) += -motor_torque * factor;
    }
}